

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_ustar.c
# Opt level: O0

int archive_write_ustar_finish_entry(archive_write *a)

{
  undefined8 *puVar1;
  int iVar2;
  long in_RDI;
  int ret;
  size_t unaff_retaddr;
  ustar *ustar;
  
  puVar1 = *(undefined8 **)(in_RDI + 0xd0);
  iVar2 = __archive_write_nulls((archive_write *)ustar,unaff_retaddr);
  puVar1[1] = 0;
  *puVar1 = 0;
  return iVar2;
}

Assistant:

static int
archive_write_ustar_finish_entry(struct archive_write *a)
{
	struct ustar *ustar;
	int ret;

	ustar = (struct ustar *)a->format_data;
	ret = __archive_write_nulls(a,
	    (size_t)(ustar->entry_bytes_remaining + ustar->entry_padding));
	ustar->entry_bytes_remaining = ustar->entry_padding = 0;
	return (ret);
}